

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O3

Test * __thiscall
testing::internal::
ParameterizedTestFactory<(anonymous_namespace)::LowBDConvolveHorizRSTest_Correctness_Test>::
CreateTest(ParameterizedTestFactory<(anonymous_namespace)::LowBDConvolveHorizRSTest_Correctness_Test>
           *this)

{
  Test *this_00;
  
  WithParamInterface<std::tuple<void(*)(unsigned_char_const*,int,unsigned_char*,int,int,int,short_const*,int,int)>>
  ::parameter_ = &this->parameter_;
  this_00 = (Test *)operator_new(0x30);
  Test::Test(this_00);
  this_00[1].gtest_flag_saver_._M_t.
  super___uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
  .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>._M_head_impl =
       (GTestFlagSaver *)0x0;
  this_00->_vptr_Test = (_func_int **)&PTR__LowBDConvolveHorizRSTest_0107d908;
  this_00[2]._vptr_Test = (_func_int **)&PTR__LowBDConvolveHorizRSTest_Correctness_Test_0107d950;
  return this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }